

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_filter(archive_read *a,int64_t *end)

{
  byte bVar1;
  int iVar2;
  uint8_t *bytes;
  ushort local_3c;
  ushort local_3a;
  uint16_t i;
  uint16_t length;
  uint8_t *code;
  uint8_t val;
  void *pvStack_28;
  uint8_t flags;
  rar *rar;
  int64_t *end_local;
  archive_read *a_local;
  
  pvStack_28 = a->format->data;
  rar = (rar *)end;
  end_local = (int64_t *)a;
  iVar2 = rar_decode_byte(a,(uint8_t *)((long)&code + 7));
  if (iVar2 == 0) {
    return 0;
  }
  local_3a = (code._7_1_ & 7) + 1;
  if (local_3a == 7) {
    iVar2 = rar_decode_byte((archive_read *)end_local,(uint8_t *)((long)&code + 6));
    if (iVar2 == 0) {
      return 0;
    }
    local_3a = code._6_1_ + 7;
  }
  else if (local_3a == 8) {
    iVar2 = rar_decode_byte((archive_read *)end_local,(uint8_t *)((long)&code + 6));
    bVar1 = code._6_1_;
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = rar_decode_byte((archive_read *)end_local,(uint8_t *)((long)&code + 6));
    if (iVar2 == 0) {
      return 0;
    }
    local_3a = CONCAT11(bVar1,code._6_1_);
  }
  bytes = (uint8_t *)malloc((ulong)local_3a);
  if (bytes == (uint8_t *)0x0) {
    a_local._4_4_ = 0;
  }
  else {
    for (local_3c = 0; local_3c < local_3a; local_3c = local_3c + 1) {
      iVar2 = rar_decode_byte((archive_read *)end_local,bytes + local_3c);
      if (iVar2 == 0) {
        free(bytes);
        return 0;
      }
    }
    iVar2 = parse_filter((archive_read *)end_local,bytes,local_3a,code._7_1_);
    if (iVar2 == 0) {
      free(bytes);
      a_local._4_4_ = 0;
    }
    else {
      free(bytes);
      if (*(long *)((long)pvStack_28 + 0x3a8) < *(long *)rar) {
        *(undefined8 *)rar = *(undefined8 *)((long)pvStack_28 + 0x3a8);
      }
      a_local._4_4_ = 1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_filter(struct archive_read *a, int64_t *end)
{
  struct rar *rar = (struct rar *)(a->format->data);
  uint8_t flags, val, *code;
  uint16_t length, i;

  if (!rar_decode_byte(a, &flags))
    return 0;
  length = (flags & 0x07) + 1;
  if (length == 7)
  {
    if (!rar_decode_byte(a, &val))
      return 0;
    length = val + 7;
  }
  else if (length == 8)
  {
    if (!rar_decode_byte(a, &val))
      return 0;
    length = val << 8;
    if (!rar_decode_byte(a, &val))
      return 0;
    length |= val;
  }

  code = malloc(length);
  if (!code)
    return 0;
  for (i = 0; i < length; i++)
  {
    if (!rar_decode_byte(a, &code[i]))
    {
      free(code);
      return 0;
    }
  }
  if (!parse_filter(a, code, length, flags))
  {
    free(code);
    return 0;
  }
  free(code);

  if (rar->filters.filterstart < *end)
    *end = rar->filters.filterstart;

  return 1;
}